

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseElementDecl(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  elementDeclSAXFunc p_Var5;
  int iVar6;
  xmlChar *pxVar7;
  char *msg;
  xmlParserErrors error;
  xmlElementContentPtr cur;
  xmlDocPtr doc;
  xmlElementContentPtr content;
  xmlElementContentPtr local_30;
  
  local_30 = (xmlElementContentPtr)0x0;
  pxVar3 = ctxt->input;
  pxVar7 = pxVar3->cur;
  if (*pxVar7 != '<') {
    return -1;
  }
  if (pxVar7[1] != '!') {
    return -1;
  }
  if (pxVar7[2] != 'E') {
    return -1;
  }
  if (pxVar7[3] != 'L') {
    return -1;
  }
  if (pxVar7[4] != 'E') {
    return -1;
  }
  if (pxVar7[5] != 'M') {
    return -1;
  }
  if (pxVar7[6] != 'E') {
    return -1;
  }
  if (pxVar7[7] != 'N') {
    return -1;
  }
  if (pxVar7[8] != 'T') {
    return -1;
  }
  iVar2 = pxVar3->id;
  pxVar3->cur = pxVar7 + 9;
  pxVar3->col = pxVar3->col + 9;
  if (pxVar7[9] == '\0') {
    xmlParserInputGrow(pxVar3,0xfa);
  }
  iVar6 = xmlSkipBlankChars(ctxt);
  if (iVar6 == 0) {
    msg = "Space required after \'ELEMENT\'\n";
    error = XML_ERR_SPACE_REQUIRED;
    goto LAB_0015e52e;
  }
  pxVar7 = xmlParseName(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    msg = "xmlParseElementDecl: no name for Element\n";
    error = XML_ERR_NAME_REQUIRED;
    goto LAB_0015e52e;
  }
  iVar6 = xmlSkipBlankChars(ctxt);
  if (iVar6 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the element name\n");
  }
  pxVar3 = ctxt->input;
  pbVar4 = pxVar3->cur;
  bVar1 = *pbVar4;
  if (bVar1 < 0x41) {
    if (bVar1 == 0x25) {
      if ((ctxt->external == 0) && (ctxt->inputNr == 1)) {
        msg = "PEReference: forbidden within markup decl in internal subset\n";
        error = XML_ERR_PEREF_IN_INT_SUBSET;
        goto LAB_0015e52e;
      }
    }
    else if (bVar1 == 0x28) {
      iVar6 = xmlParseElementContentDecl(ctxt,pxVar7,&local_30);
LAB_0015e3b6:
      xmlSkipBlankChars(ctxt);
      if (*ctxt->input->cur == '>') {
        if (iVar2 != ctxt->input->id) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "Element declaration doesn\'t start and stop in the same entity\n");
        }
        xmlNextChar(ctxt);
        cur = local_30;
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var5 = ctxt->sax->elementDecl, p_Var5 != (elementDeclSAXFunc)0x0)) {
          if (local_30 == (xmlElementContentPtr)0x0) {
            (*p_Var5)(ctxt->userData,pxVar7,iVar6,(xmlElementContentPtr)0x0);
            return iVar6;
          }
          local_30->parent = (_xmlElementContent *)0x0;
          (*p_Var5)(ctxt->userData,pxVar7,iVar6,local_30);
          if (cur->parent != (_xmlElementContent *)0x0) {
            return iVar6;
          }
          doc = ctxt->myDoc;
          goto LAB_0015e55f;
        }
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
      }
      if (local_30 == (xmlElementContentPtr)0x0) {
        return iVar6;
      }
      doc = ctxt->myDoc;
      cur = local_30;
LAB_0015e55f:
      xmlFreeDocElementContent(doc,cur);
      return iVar6;
    }
  }
  else if (bVar1 == 0x41) {
    if ((pbVar4[1] == 0x4e) && (pbVar4[2] == 0x59)) {
      pxVar3->cur = pbVar4 + 3;
      pxVar3->col = pxVar3->col + 3;
      iVar6 = 2;
      bVar1 = pbVar4[3];
      goto joined_r0x0015e50a;
    }
  }
  else if ((((bVar1 == 0x45) && (pbVar4[1] == 0x4d)) && (pbVar4[2] == 0x50)) &&
          ((pbVar4[3] == 0x54 && (pbVar4[4] == 0x59)))) {
    pxVar3->cur = pbVar4 + 5;
    pxVar3->col = pxVar3->col + 5;
    iVar6 = 1;
    bVar1 = pbVar4[5];
joined_r0x0015e50a:
    if (bVar1 == 0) {
      xmlParserInputGrow(pxVar3,0xfa);
    }
    goto LAB_0015e3b6;
  }
  msg = "xmlParseElementDecl: \'EMPTY\', \'ANY\' or \'(\' expected\n";
  error = XML_ERR_ELEMCONTENT_NOT_STARTED;
LAB_0015e52e:
  xmlFatalErrMsg(ctxt,error,msg);
  return -1;
}

Assistant:

int
xmlParseElementDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    int ret = -1;
    xmlElementContentPtr content  = NULL;

    /* GROW; done in the caller */
    if (CMP9(CUR_PTR, '<', '!', 'E', 'L', 'E', 'M', 'E', 'N', 'T')) {
	int inputid = ctxt->input->id;

	SKIP(9);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space required after 'ELEMENT'\n");
	    return(-1);
	}
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "xmlParseElementDecl: no name for Element\n");
	    return(-1);
	}
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the element name\n");
	}
	if (CMP5(CUR_PTR, 'E', 'M', 'P', 'T', 'Y')) {
	    SKIP(5);
	    /*
	     * Element must always be empty.
	     */
	    ret = XML_ELEMENT_TYPE_EMPTY;
	} else if ((RAW == 'A') && (NXT(1) == 'N') &&
	           (NXT(2) == 'Y')) {
	    SKIP(3);
	    /*
	     * Element is a generic container.
	     */
	    ret = XML_ELEMENT_TYPE_ANY;
	} else if (RAW == '(') {
	    ret = xmlParseElementContentDecl(ctxt, name, &content);
	} else {
	    /*
	     * [ WFC: PEs in Internal Subset ] error handling.
	     */
	    if ((RAW == '%') && (ctxt->external == 0) &&
	        (ctxt->inputNr == 1)) {
		xmlFatalErrMsg(ctxt, XML_ERR_PEREF_IN_INT_SUBSET,
	  "PEReference: forbidden within markup decl in internal subset\n");
	    } else {
		xmlFatalErrMsg(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED,
		      "xmlParseElementDecl: 'EMPTY', 'ANY' or '(' expected\n");
            }
	    return(-1);
	}

	SKIP_BLANKS;

	if (RAW != '>') {
	    xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
	    if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element declaration doesn't start and stop in"
                               " the same entity\n");
	    }

	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->elementDecl != NULL)) {
		if (content != NULL)
		    content->parent = NULL;
	        ctxt->sax->elementDecl(ctxt->userData, name, ret,
		                       content);
		if ((content != NULL) && (content->parent == NULL)) {
		    /*
		     * this is a trick: if xmlAddElementDecl is called,
		     * instead of copying the full tree it is plugged directly
		     * if called from the parser. Avoid duplicating the
		     * interfaces or change the API/ABI
		     */
		    xmlFreeDocElementContent(ctxt->myDoc, content);
		}
	    } else if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	}
    }
    return(ret);
}